

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

void predict(svm_params *params,svm_example **ec_arr,float *scores,size_t n)

{
  svm_model *psVar1;
  float *pfVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  
  if (n != 0) {
    psVar1 = params->model;
    sVar4 = 0;
    do {
      svm_example::compute_kernels(ec_arr[sVar4],params);
      pfVar2 = (ec_arr[sVar4]->krow)._begin;
      if ((ec_arr[sVar4]->krow)._end == pfVar2) {
        fVar6 = 0.0;
      }
      else {
        sVar3 = psVar1->num_support;
        if (sVar3 == 0) {
          fVar6 = 0.0;
        }
        else {
          fVar6 = 0.0;
          sVar5 = 0;
          do {
            fVar6 = fVar6 + pfVar2[sVar5] * (psVar1->alpha)._begin[sVar5];
            sVar5 = sVar5 + 1;
          } while (sVar3 != sVar5);
        }
        fVar6 = fVar6 / params->lambda;
      }
      scores[sVar4] = fVar6;
      sVar4 = sVar4 + 1;
    } while (sVar4 != n);
  }
  return;
}

Assistant:

void predict(svm_params& params, svm_example** ec_arr, float* scores, size_t n)
{
  svm_model* model = params.model;
  for (size_t i = 0; i < n; i++)
  {
    ec_arr[i]->compute_kernels(params);
    // cout<<"size of krow = "<<ec_arr[i]->krow.size()<<endl;
    if (ec_arr[i]->krow.size() > 0)
      scores[i] = dense_dot(ec_arr[i]->krow.begin(), model->alpha, model->num_support) / params.lambda;
    else
      scores[i] = 0;
  }
}